

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::_internal_add_values
          (TensorValue_RepeatedFloats *this,float value)

{
  float local_14;
  TensorValue_RepeatedFloats *pTStack_10;
  float value_local;
  TensorValue_RepeatedFloats *this_local;
  
  local_14 = value;
  pTStack_10 = this;
  google::protobuf::RepeatedField<float>::Add(&this->values_,&local_14);
  return;
}

Assistant:

inline void TensorValue_RepeatedFloats::_internal_add_values(float value) {
  values_.Add(value);
}